

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Section::~Section(Section *this)

{
  IResultCapture *pIVar1;
  double dVar2;
  Section *this_local;
  
  if ((this->m_sectionIncluded & 1U) != 0) {
    pIVar1 = getResultCapture();
    dVar2 = Timer::getElapsedSeconds(&this->m_timer);
    (*pIVar1->_vptr_IResultCapture[4])(dVar2,pIVar1,this,&this->m_assertions);
  }
  std::__cxx11::string::~string((string *)&this->m_name);
  SectionInfo::~SectionInfo(&this->m_info);
  return;
}

Assistant:

Section::~Section() {
        if( m_sectionIncluded )
            getResultCapture().sectionEnded( m_info, m_assertions, m_timer.getElapsedSeconds() );
    }